

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

void __thiscall leveldb::VersionEdit::Clear(VersionEdit *this)

{
  VersionEdit *this_local;
  
  std::__cxx11::string::clear();
  this->log_number_ = 0;
  this->prev_log_number_ = 0;
  this->last_sequence_ = 0;
  this->next_file_number_ = 0;
  this->has_comparator_ = false;
  this->has_log_number_ = false;
  this->has_prev_log_number_ = false;
  this->has_next_file_number_ = false;
  this->has_last_sequence_ = false;
  std::
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::clear(&this->deleted_files_);
  std::
  vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ::clear(&this->new_files_);
  return;
}

Assistant:

void VersionEdit::Clear() {
  comparator_.clear();
  log_number_ = 0;
  prev_log_number_ = 0;
  last_sequence_ = 0;
  next_file_number_ = 0;
  has_comparator_ = false;
  has_log_number_ = false;
  has_prev_log_number_ = false;
  has_next_file_number_ = false;
  has_last_sequence_ = false;
  deleted_files_.clear();
  new_files_.clear();
}